

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

void nifti_swap_4bytes(size_t n,void *ar)

{
  uchar uVar1;
  uchar tval;
  uchar *cp2;
  uchar *cp1;
  uchar *cp0;
  size_t ii;
  void *ar_local;
  size_t n_local;
  
  cp1 = (uchar *)ar;
  for (cp0 = (uchar *)0x0; cp0 < n; cp0 = cp0 + 1) {
    uVar1 = *cp1;
    *cp1 = cp1[3];
    cp1[3] = uVar1;
    uVar1 = cp1[1];
    cp1[1] = cp1[2];
    cp1[2] = uVar1;
    cp1 = cp1 + 4;
  }
  return;
}

Assistant:

void nifti_swap_4bytes( size_t n , void *ar )    /* 4 bytes at a time */
{
   register size_t ii ;
   unsigned char * cp0 = (unsigned char *)ar, * cp1, * cp2 ;
   register unsigned char tval ;

   for( ii=0 ; ii < n ; ii++ ){
       cp1 = cp0; cp2 = cp0+3;
       tval = *cp1;  *cp1 = *cp2;  *cp2 = tval;
       cp1++;  cp2--;
       tval = *cp1;  *cp1 = *cp2;  *cp2 = tval;
       cp0 += 4;
   }
   return ;
}